

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O3

LY_ERR lyplg_ext_get_data(ly_ctx *ctx,lysc_ext_instance *ext,void **ext_data,ly_bool *ext_data_free)

{
  LY_ERR err;
  char *format;
  
  if (ctx->ext_clb == (ly_ext_data_clb)0x0) {
    format = "Failed to get extension data, no callback set.";
    err = LY_EINVAL;
  }
  else {
    err = (*ctx->ext_clb)(ext,ctx->ext_clb_data,ext_data,ext_data_free);
    if (err == LY_SUCCESS) {
      return LY_SUCCESS;
    }
    format = "Callback for getting ext data failed.";
  }
  lyplg_ext_compile_log((lysc_ctx *)0x0,ext,LY_LLERR,err,format);
  return err;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_get_data(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, void **ext_data, ly_bool *ext_data_free)
{
    LY_ERR rc;

    if (!ctx->ext_clb) {
        lyplg_ext_compile_log(NULL, ext, LY_LLERR, LY_EINVAL, "Failed to get extension data, no callback set.");
        return LY_EINVAL;
    }

    if ((rc = ctx->ext_clb(ext, ctx->ext_clb_data, ext_data, ext_data_free))) {
        lyplg_ext_compile_log(NULL, ext, LY_LLERR, rc, "Callback for getting ext data failed.");
    }
    return rc;
}